

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_compositions.h
# Opt level: O2

void __thiscall icu_63::numparse::impl::SeriesMatcher::~SeriesMatcher(SeriesMatcher *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

class U_I18N_API SeriesMatcher : public CompositionMatcher {
  public:
    bool match(StringSegment& segment, ParsedNumber& result, UErrorCode& status) const override;

    bool smokeTest(const StringSegment& segment) const override;

    void postProcess(ParsedNumber& result) const override;

    virtual int32_t length() const = 0;

  protected:
    // No construction except by subclasses!
    SeriesMatcher() = default;
}